

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b88.hpp
# Opt level: O2

void ExchCXX::kernel_traits<ExchCXX::BuiltinB88>::eval_exc_polar_impl
               (double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
               double *eps)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double __x;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  undefined8 local_c8;
  undefined8 uStack_c0;
  
  dVar16 = 1.0 / (rho_a + rho_b);
  dVar17 = (rho_a - rho_b) * dVar16;
  dVar3 = cbrt(1e-15);
  dVar4 = cbrt(rho_a + rho_b);
  dVar5 = cbrt(rho_a);
  if (sigma_aa < 0.0) {
    dVar6 = sqrt(sigma_aa);
  }
  else {
    dVar6 = SQRT(sigma_aa);
  }
  dVar7 = cbrt(rho_b);
  uVar1 = -(ulong)((rho_a + rho_a) * dVar16 <= 1e-15);
  uVar2 = -(ulong)((rho_b + rho_b) * dVar16 <= 1e-15);
  auVar13._0_8_ = ~uVar1 & (ulong)(1.0 - dVar17);
  auVar13._8_8_ = ~uVar2 & (ulong)(dVar17 + 1.0);
  auVar10._0_8_ = uVar1 & 0x3ffffffffffffffc;
  auVar10._8_8_ = uVar2 & 0x3ffffffffffffffc;
  auVar10 = auVar10 | auVar13;
  auVar14._0_8_ = auVar10._8_8_;
  auVar14._8_4_ = auVar10._0_4_;
  auVar14._12_4_ = auVar10._4_4_;
  dVar16 = (double)(uVar1 & 0x3cd2000000000000 | ~uVar1 & auVar14._0_8_);
  __x = (double)(uVar2 & 0x3cd2000000000000 | ~uVar2 & auVar14._8_8_);
  dVar17 = cbrt(dVar16);
  dVar6 = ((1.0 / dVar5) / rho_a) * dVar6;
  dVar8 = log(SQRT(dVar6 * dVar6 + 1.0) + dVar6);
  dVar9 = cbrt(__x);
  auVar11._0_8_ = dVar5 * dVar5;
  auVar11._8_8_ = dVar7 * dVar7;
  auVar11 = divpd(_DAT_010020a0,auVar11);
  auVar12._8_8_ = rho_b * rho_b;
  auVar12._0_8_ = rho_a * rho_a;
  auVar12 = divpd(auVar11,auVar12);
  if (sigma_bb < 0.0) {
    dVar5 = sqrt(sigma_bb);
  }
  else {
    dVar5 = SQRT(sigma_bb);
  }
  dVar5 = dVar5 * ((1.0 / dVar7) / rho_b);
  dVar7 = log(SQRT(dVar5 * dVar5 + 1.0) + dVar5);
  auVar15._0_8_ = dVar8 * dVar6 * 0.0252 + (double)DAT_010020a0;
  auVar15._8_8_ = dVar7 * dVar5 * 0.0252 + DAT_010020a0._8_8_;
  auVar11 = divpd(_DAT_010020a0,auVar15);
  local_c8 = auVar12._0_8_;
  uStack_c0 = auVar12._8_8_;
  *eps = (double)(-(ulong)(1e-25 < rho_b) &
                 (ulong)(dVar4 * (double)(~-(ulong)(__x <= 1e-15) & (ulong)(dVar9 * __x) |
                                         (ulong)(dVar3 * 1e-15) & -(ulong)(__x <= 1e-15)) *
                         -0.36927938319101117 *
                        (sigma_bb * 1.5874010519681996 * 0.0028433756331771257 * uStack_c0 *
                         auVar11._8_8_ + DAT_010020a0._8_8_))) +
         (double)(-(ulong)(1e-25 < rho_a) &
                 (ulong)(dVar4 * (double)(~-(ulong)(dVar16 <= 1e-15) & (ulong)(dVar17 * dVar16) |
                                         (ulong)(dVar3 * 1e-15) & -(ulong)(dVar16 <= 1e-15)) *
                         -0.36927938319101117 *
                        (sigma_aa * 1.5874010519681996 * 0.0028433756331771257 * local_c8 *
                         auVar11._0_8_ + (double)DAT_010020a0)));
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar_impl( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double& eps ) {

    (void)(sigma_ab);
    (void)(eps);
    constexpr double t2 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_pi;
    constexpr double t31 = constants::m_cbrt_one_ov_pi;
    constexpr double t34 = constants::m_cbrt_4;
    constexpr double t5 = t2 / t3;
    constexpr double t28 = t2 * t2;
    constexpr double t29 = beta * t28;
    constexpr double t32 = 0.1e1 / t31;
    constexpr double t33 = t29 * t32;
    constexpr double t41 = gamma * beta;


    const double t1 = rho_a <= dens_tol;
    const double t6 = rho_a + rho_b;
    const double t7 = 0.1e1 / t6;
    const double t10 = 0.2e1 * rho_a * t7 <= zeta_tol;
    const double t11 = zeta_tol - 0.1e1;
    const double t14 = 0.2e1 * rho_b * t7 <= zeta_tol;
    const double t15 = -t11;
    const double t16 = rho_a - rho_b;
    const double t18 = piecewise_functor_5( t10, t11, t14, t15, t16 * t7 );
    const double t19 = 0.1e1 + t18;
    const double t20 = t19 <= zeta_tol;
    const double t21 = safe_math::cbrt( zeta_tol );
    const double t22 = t21 * zeta_tol;
    const double t23 = safe_math::cbrt( t19 );
    const double t25 = piecewise_functor_3( t20, t22, t23 * t19 );
    const double t26 = safe_math::cbrt( t6 );
    const double t27 = t25 * t26;
    const double t35 = t34 * sigma_aa;
    const double t36 = rho_a * rho_a;
    const double t37 = safe_math::cbrt( rho_a );
    const double t38 = t37 * t37;
    const double t40 = 0.1e1 / t38 / t36;
    const double t42 = safe_math::sqrt( sigma_aa );
    const double t44 = 0.1e1 / t37 / rho_a;
    const double t45 = t42 * t44;
    const double t46 = safe_math::log( t45 + safe_math::sqrt( t45 * t45 + 0.1e1 ) );
    const double t49 = t41 * t45 * t46 + 0.1e1;
    const double t50 = 0.1e1 / t49;
    const double t55 = 0.1e1 + 0.2e1 / 0.9e1 * t33 * t35 * t40 * t50;
    const double t59 = piecewise_functor_3( t1, 0.0, -0.3e1 / 0.8e1 * t5 * t27 * t55 );
    const double t60 = rho_b <= dens_tol;
    const double t61 = -t16;
    const double t63 = piecewise_functor_5( t14, t11, t10, t15, t61 * t7 );
    const double t64 = 0.1e1 + t63;
    const double t65 = t64 <= zeta_tol;
    const double t66 = safe_math::cbrt( t64 );
    const double t68 = piecewise_functor_3( t65, t22, t66 * t64 );
    const double t69 = t68 * t26;
    const double t70 = t34 * sigma_bb;
    const double t71 = rho_b * rho_b;
    const double t72 = safe_math::cbrt( rho_b );
    const double t73 = t72 * t72;
    const double t75 = 0.1e1 / t73 / t71;
    const double t76 = safe_math::sqrt( sigma_bb );
    const double t78 = 0.1e1 / t72 / rho_b;
    const double t79 = t76 * t78;
    const double t80 = safe_math::log( t79 + safe_math::sqrt( t79 * t79 + 0.1e1 ) );
    const double t83 = t41 * t79 * t80 + 0.1e1;
    const double t84 = 0.1e1 / t83;
    const double t89 = 0.1e1 + 0.2e1 / 0.9e1 * t33 * t70 * t75 * t84;
    const double t93 = piecewise_functor_3( t60, 0.0, -0.3e1 / 0.8e1 * t5 * t69 * t89 );


    eps = t59 + t93;

  }